

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  secp256k1_gej b2;
  secp256k1_gej a2;
  
  uVar1 = 0;
  if (a->infinity == b->infinity) {
    if (a->infinity == 0) {
      memcpy(&a2,a,0x98);
      memcpy(&b2,b,0x98);
      secp256k1_fe_normalize(&a2.x);
      secp256k1_fe_normalize(&a2.y);
      secp256k1_fe_normalize(&a2.z);
      secp256k1_fe_normalize(&b2.x);
      secp256k1_fe_normalize(&b2.y);
      secp256k1_fe_normalize(&b2.z);
      iVar2 = secp256k1_fe_cmp_var(&a2.x,&b2.x);
      iVar3 = secp256k1_fe_cmp_var(&a2.y,&b2.y);
      iVar4 = secp256k1_fe_cmp_var(&a2.z,&b2.z);
      uVar1 = (uint)(iVar4 == 0 && (iVar3 == 0 && iVar2 == 0));
    }
    else {
      uVar1 = 1;
    }
  }
  return uVar1;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}